

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

bool CoreML::hasIOS12Features(Model *model)

{
  bool bVar1;
  TypeCase TVar2;
  Pipeline *pPVar3;
  RepeatedPtrField<CoreML::Specification::Model> *pRVar4;
  reference pMVar5;
  PipelineRegressor *this;
  PipelineClassifier *this_00;
  bool local_88;
  bool local_87;
  bool local_86;
  bool local_85;
  Model *m_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  RepeatedPtrField<CoreML::Specification::Model> *__range2_2;
  Model *m_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  RepeatedPtrField<CoreML::Specification::Model> *__range2_1;
  Model *m;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<CoreML::Specification::Model> *__range2;
  bool result;
  Model *model_local;
  
  __range2._7_1_ = false;
  TVar2 = Specification::Model::Type_case(model);
  if (TVar2 == kPipelineClassifier) {
    this_00 = Specification::Model::pipelineclassifier(model);
    pPVar3 = Specification::PipelineClassifier::pipeline(this_00);
    pRVar4 = Specification::Pipeline::models(pPVar3);
    __end2_2 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::begin(pRVar4);
    m_2 = (Model *)google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::end(pRVar4);
    while (bVar1 = google::protobuf::internal::
                   RepeatedPtrIterator<const_CoreML::Specification::Model>::operator!=
                             (&__end2_2,(iterator *)&m_2), bVar1) {
      pMVar5 = google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
               operator*(&__end2_2);
      local_87 = true;
      if (__range2._7_1_ == false) {
        local_87 = hasIOS12Features(pMVar5);
      }
      __range2._7_1_ = local_87;
      if (local_87 != false) {
        return true;
      }
      google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
      operator++(&__end2_2);
    }
  }
  else if (TVar2 == kPipelineRegressor) {
    this = Specification::Model::pipelineregressor(model);
    pPVar3 = Specification::PipelineRegressor::pipeline(this);
    pRVar4 = Specification::Pipeline::models(pPVar3);
    __end2_1 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::begin(pRVar4);
    m_1 = (Model *)google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::end(pRVar4);
    while (bVar1 = google::protobuf::internal::
                   RepeatedPtrIterator<const_CoreML::Specification::Model>::operator!=
                             (&__end2_1,(iterator *)&m_1), bVar1) {
      pMVar5 = google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
               operator*(&__end2_1);
      local_86 = true;
      if (__range2._7_1_ == false) {
        local_86 = hasIOS12Features(pMVar5);
      }
      __range2._7_1_ = local_86;
      if (local_86 != false) {
        return true;
      }
      google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
      operator++(&__end2_1);
    }
  }
  else {
    if (TVar2 != kPipeline) {
      bVar1 = hasFlexibleShapes(model);
      local_88 = true;
      if (!bVar1) {
        bVar1 = hasCustomModel(model);
        local_88 = true;
        if (!bVar1) {
          bVar1 = hasCategoricalSequences(model);
          local_88 = true;
          if (!bVar1) {
            bVar1 = hasAppleTextClassifier(model);
            local_88 = true;
            if (!bVar1) {
              bVar1 = hasAppleWordTagger(model);
              local_88 = true;
              if (!bVar1) {
                bVar1 = hasScenePrint(model);
                local_88 = true;
                if (!bVar1) {
                  bVar1 = hasUnsignedQuantizedWeights(model);
                  local_88 = true;
                  if (!bVar1) {
                    bVar1 = hasNonmaxSuppression(model);
                    local_88 = true;
                    if (!bVar1) {
                      bVar1 = hasBayesianProbitRegressor(model);
                      local_88 = true;
                      if (!bVar1) {
                        local_88 = hasIOS12NewNeuralNetworkLayers(model);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      return local_88;
    }
    pPVar3 = Specification::Model::pipeline(model);
    pRVar4 = Specification::Pipeline::models(pPVar3);
    __end2 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::begin(pRVar4);
    m = (Model *)google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::end(pRVar4);
    while (bVar1 = google::protobuf::internal::
                   RepeatedPtrIterator<const_CoreML::Specification::Model>::operator!=
                             (&__end2,(iterator *)&m), bVar1) {
      pMVar5 = google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
               operator*(&__end2);
      local_85 = true;
      if (__range2._7_1_ == false) {
        local_85 = hasIOS12Features(pMVar5);
      }
      __range2._7_1_ = local_85;
      if (local_85 != false) {
        return true;
      }
      google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
      operator++(&__end2);
    }
  }
  return false;
}

Assistant:

bool CoreML::hasIOS12Features(const Specification::Model& model) {
    // New IOS12 features: flexible shapes, custom model, sequence feature type,
    // text classifier, word tagger, vision feature print, unsigned integer quantization
    bool result = false;
    switch (model.Type_case()) {
        case Specification::Model::kPipeline:
            for (auto &m : model.pipeline().models()) {
                result = result || hasIOS12Features(m);
                if (result) {
                    return true;
                }
            }
            break;
        case Specification::Model::kPipelineRegressor:
            for (auto &m : model.pipelineregressor().pipeline().models()) {
                result = result ||hasIOS12Features(m);
                if (result) {
                    return true;
                }
            }
            break;
        case Specification::Model::kPipelineClassifier:
            for (auto &m : model.pipelineclassifier().pipeline().models()) {
                result = result || hasIOS12Features(m);
                if (result) {
                    return true;
                }
            }
            break;
        default:
            return (hasFlexibleShapes(model) || hasCustomModel(model) || hasCategoricalSequences(model) ||
                    hasAppleTextClassifier(model) || hasAppleWordTagger(model) ||
                    hasScenePrint(model) || hasUnsignedQuantizedWeights(model) ||
                    hasNonmaxSuppression(model) || hasBayesianProbitRegressor(model) ||
                    hasIOS12NewNeuralNetworkLayers(model));
    }
    return false;
}